

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O1

void __thiscall TestRegenerateCmakeHeader::Run(TestRegenerateCmakeHeader *this)

{
  int iVar1;
  runtime_error *this_00;
  bool bVar2;
  string expectedOutput;
  ostringstream oss;
  Configuration config;
  undefined1 *local_3d8;
  size_t local_3d0;
  undefined1 local_3c8 [16];
  undefined1 *local_3b8;
  size_t local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [376];
  Configuration local_220;
  
  Configuration::Configuration(&local_220);
  std::__cxx11::string::_M_replace
            ((ulong)&local_220,0,(char *)local_220.companyName._M_string_length,0x12759b);
  std::__cxx11::string::_M_replace
            ((ulong)&local_220.licenseString,0,(char *)local_220.licenseString._M_string_length,
             0x1275a6);
  std::__cxx11::string::_M_replace
            ((ulong)&local_220.regenTag,0,(char *)local_220.regenTag._M_string_length,0x1275bc);
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,
             "#\n# Copyright (c) My Company. All rights reserved.\n# My\n# multiline\n# license.\n#\n\n# AUTOGENERATED - do not edit, your changes will be lost\n# If you must edit, remove these two lines to avoid regeneration\n\n"
             ,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
  RegenerateCmakeHeader((ostream *)local_398,&local_220);
  std::__cxx11::stringbuf::str();
  if (local_3b0 == local_3d0) {
    if (local_3b0 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_3b8,local_3d8,local_3b0);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
    std::ios_base::~ios_base((ios_base *)(local_398 + 0x70));
    if (local_3d8 != local_3c8) {
      operator_delete(local_3d8);
    }
    Configuration::~Configuration(&local_220);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeHeader) {
  Configuration config;
  config.companyName = "My Company";
  config.licenseString = "My\nmultiline\nlicense.";
  config.regenTag = "AUTOGENERATED";

  const std::string expectedOutput(
      "#\n"
      "# Copyright (c) My Company. All rights reserved.\n"
      "# My\n"
      "# multiline\n"
      "# license.\n"
      "#\n"
      "\n"
      "# AUTOGENERATED - do not edit, your changes will be lost\n"
      "# If you must edit, remove these two lines to avoid regeneration\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeHeader(oss, config);

  ASSERT(oss.str() == expectedOutput);
}